

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGStatesPtr *ppxVar1;
  uint uVar2;
  xmlRelaxNGStatesPtr pxVar3;
  int iVar4;
  xmlRelaxNGValidStatePtr *ppxVar5;
  xmlRelaxNGValidStatePtr state;
  ulong uVar6;
  xmlRelaxNGStatesPtr states;
  xmlRelaxNGStatesPtr states_00;
  long lVar7;
  xmlRelaxNGValidStatePtr *ppxVar8;
  long lVar9;
  uint local_54;
  
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  ppxVar1 = &ctxt->states;
  pxVar3 = ctxt->states;
  if (pxVar3 != (xmlRelaxNGStatesPtr)0x0) {
    iVar4 = pxVar3->nbState;
    if (iVar4 != 1) {
      ppxVar8 = &ctxt->state;
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
      uVar2 = ctxt->flags;
      ctxt->flags = uVar2 | 1;
      if (iVar4 < 1) {
        ctxt->flags = uVar2;
LAB_001810d4:
        xmlRelaxNGFreeStates(ctxt,pxVar3);
        iVar4 = -1;
        if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else {
        lVar9 = 0;
        local_54 = 0;
        states_00 = (xmlRelaxNGStatesPtr)0x0;
        do {
          ctxt->state = pxVar3->tabState[lVar9];
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
          iVar4 = xmlRelaxNGValidateState(ctxt,define);
          state = ctxt->state;
          if (state == (xmlRelaxNGValidStatePtr)0x0) {
LAB_00180f77:
            state = (xmlRelaxNGValidStatePtr)0x0;
          }
          else if (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0) {
            xmlRelaxNGFreeValidState(ctxt,state);
            ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
            goto LAB_00180f77;
          }
          ppxVar5 = ppxVar8;
          if (iVar4 == 0) {
            states = *ppxVar1;
            if (states == (xmlRelaxNGStatesPtr)0x0) {
              if (states_00 == (xmlRelaxNGStatesPtr)0x0) {
                lVar7 = (long)(int)local_54;
                local_54 = local_54 + 1;
                pxVar3->tabState[lVar7] = state;
                states_00 = (xmlRelaxNGStatesPtr)0x0;
              }
              else {
                xmlRelaxNGAddStates(ctxt,states_00,state);
              }
              goto LAB_0018109e;
            }
            if (states_00 != (xmlRelaxNGStatesPtr)0x0) {
              if (0 < states->nbState) {
                lVar7 = 0;
                do {
                  xmlRelaxNGAddStates(ctxt,states_00,states->tabState[lVar7]);
                  lVar7 = lVar7 + 1;
                  states = ctxt->states;
                } while (lVar7 < states->nbState);
              }
              goto LAB_00181018;
            }
            *ppxVar1 = (xmlRelaxNGStatesPtr)0x0;
            states_00 = states;
            if (0 < (int)local_54) {
              uVar6 = 0;
              do {
                xmlRelaxNGAddStates(ctxt,states,pxVar3->tabState[uVar6]);
                uVar6 = uVar6 + 1;
              } while (local_54 != uVar6);
            }
          }
          else {
            if (state == (xmlRelaxNGValidStatePtr)0x0) {
              states = *ppxVar1;
              if (states == (xmlRelaxNGStatesPtr)0x0) goto LAB_001810a5;
              if (0 < states->nbState) {
                lVar7 = 0;
                do {
                  xmlRelaxNGFreeValidState(ctxt,states->tabState[lVar7]);
                  lVar7 = lVar7 + 1;
                  states = ctxt->states;
                } while (lVar7 < states->nbState);
              }
LAB_00181018:
              xmlRelaxNGFreeStates(ctxt,states);
              ppxVar5 = (xmlRelaxNGValidStatePtr *)ppxVar1;
            }
            else {
              xmlRelaxNGFreeValidState(ctxt,state);
            }
LAB_0018109e:
            *ppxVar5 = (xmlRelaxNGValidStatePtr)0x0;
          }
LAB_001810a5:
          lVar9 = lVar9 + 1;
        } while (lVar9 < pxVar3->nbState);
        ctxt->flags = uVar2;
        if (states_00 == (xmlRelaxNGStatesPtr)0x0) {
          if ((int)local_54 < 2) {
            if (local_54 != 1) goto LAB_001810d4;
            ctxt->state = *pxVar3->tabState;
            xmlRelaxNGFreeStates(ctxt,pxVar3);
          }
          else {
            pxVar3->nbState = local_54;
            *ppxVar1 = pxVar3;
          }
        }
        else {
          xmlRelaxNGFreeStates(ctxt,pxVar3);
          ctxt->states = states_00;
        }
        iVar4 = 0;
      }
      if (*ppxVar8 == (xmlRelaxNGValidStatePtr)0x0) {
        return iVar4;
      }
      if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
        return iVar4;
      }
      xmlRelaxNGFreeValidState(ctxt,*ppxVar8);
      goto LAB_0018114f;
    }
    ctxt->state = *pxVar3->tabState;
    xmlRelaxNGFreeStates(ctxt,pxVar3);
    ctxt->states = (xmlRelaxNGStatesPtr)0x0;
  }
  iVar4 = xmlRelaxNGValidateState(ctxt,define);
  if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
    if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
      return iVar4;
    }
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  pxVar3 = *ppxVar1;
  if (pxVar3 == (xmlRelaxNGStatesPtr)0x0) {
    return iVar4;
  }
  if (pxVar3->nbState != 1) {
    return iVar4;
  }
  ctxt->state = *pxVar3->tabState;
  xmlRelaxNGFreeStates(ctxt,pxVar3);
  ppxVar8 = (xmlRelaxNGValidStatePtr *)ppxVar1;
LAB_0018114f:
  *ppxVar8 = (xmlRelaxNGValidStatePtr)0x0;
  return iVar4;
}

Assistant:

static int
xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    xmlRelaxNGStatesPtr states, res;
    int i, j, k, ret, oldflags;

    /*
     * We should NOT have both ctxt->state and ctxt->states
     */
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }

    if ((ctxt->states == NULL) || (ctxt->states->nbState == 1)) {
        if (ctxt->states != NULL) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        ret = xmlRelaxNGValidateState(ctxt, define);
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if ((ctxt->states != NULL) && (ctxt->states->nbState == 1)) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        return (ret);
    }

    states = ctxt->states;
    ctxt->states = NULL;
    res = NULL;
    j = 0;
    oldflags = ctxt->flags;
    ctxt->flags |= FLAGS_IGNORABLE;
    for (i = 0; i < states->nbState; i++) {
        ctxt->state = states->tabState[i];
        ctxt->states = NULL;
        ret = xmlRelaxNGValidateState(ctxt, define);
        /*
         * We should NOT have both ctxt->state and ctxt->states
         */
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if (ret == 0) {
            if (ctxt->states == NULL) {
                if (res != NULL) {
                    /* add the state to the container */
                    xmlRelaxNGAddStates(ctxt, res, ctxt->state);
                    ctxt->state = NULL;
                } else {
                    /* add the state directly in states */
                    states->tabState[j++] = ctxt->state;
                    ctxt->state = NULL;
                }
            } else {
                if (res == NULL) {
                    /* make it the new container and copy other results */
                    res = ctxt->states;
                    ctxt->states = NULL;
                    for (k = 0; k < j; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            states->tabState[k]);
                } else {
                    /* add all the new results to res and reff the container */
                    for (k = 0; k < ctxt->states->nbState; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            ctxt->states->tabState[k]);
                    xmlRelaxNGFreeStates(ctxt, ctxt->states);
                    ctxt->states = NULL;
                }
            }
        } else {
            if (ctxt->state != NULL) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->state);
                ctxt->state = NULL;
            } else if (ctxt->states != NULL) {
                for (k = 0; k < ctxt->states->nbState; k++)
                    xmlRelaxNGFreeValidState(ctxt,
                                             ctxt->states->tabState[k]);
                xmlRelaxNGFreeStates(ctxt, ctxt->states);
                ctxt->states = NULL;
            }
        }
    }
    ctxt->flags = oldflags;
    if (res != NULL) {
        xmlRelaxNGFreeStates(ctxt, states);
        ctxt->states = res;
        ret = 0;
    } else if (j > 1) {
        states->nbState = j;
        ctxt->states = states;
        ret = 0;
    } else if (j == 1) {
        ctxt->state = states->tabState[0];
        xmlRelaxNGFreeStates(ctxt, states);
        ret = 0;
    } else {
        ret = -1;
        xmlRelaxNGFreeStates(ctxt, states);
        if (ctxt->states != NULL) {
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
    }
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }
    return (ret);
}